

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repattrn.cpp
# Opt level: O3

void __thiscall icu_63::RegexPattern::zap(RegexPattern *this)

{
  UnicodeSet *pUVar1;
  uint index;
  void *in_RSI;
  UVector *this_00;
  
  if (this->fCompiledPat != (UVector64 *)0x0) {
    (*(this->fCompiledPat->super_UObject)._vptr_UObject[1])();
  }
  this->fCompiledPat = (UVector64 *)0x0;
  this_00 = this->fSets;
  if (1 < this_00->count) {
    index = 1;
    do {
      in_RSI = (void *)(ulong)index;
      pUVar1 = (UnicodeSet *)UVector::elementAt(this_00,index);
      if (pUVar1 != (UnicodeSet *)0x0) {
        UnicodeSet::~UnicodeSet(pUVar1);
        UMemory::operator_delete((UMemory *)pUVar1,in_RSI);
      }
      index = index + 1;
      this_00 = this->fSets;
    } while ((int)index < this_00->count);
  }
  (*(this_00->super_UObject)._vptr_UObject[1])();
  this->fSets = (UVector *)0x0;
  if ((UMemory *)this->fSets8 != (UMemory *)0x0) {
    UMemory::operator_delete__((UMemory *)this->fSets8,in_RSI);
  }
  this->fSets8 = (Regex8BitSet *)0x0;
  if (this->fGroupMap != (UVector32 *)0x0) {
    (*(this->fGroupMap->super_UObject)._vptr_UObject[1])();
  }
  this->fGroupMap = (UVector32 *)0x0;
  pUVar1 = this->fInitialChars;
  if (pUVar1 != (UnicodeSet *)0x0) {
    UnicodeSet::~UnicodeSet(pUVar1);
  }
  UMemory::operator_delete((UMemory *)pUVar1,in_RSI);
  this->fInitialChars = (UnicodeSet *)0x0;
  UMemory::operator_delete((UMemory *)this->fInitialChars8,in_RSI);
  this->fInitialChars8 = (Regex8BitSet *)0x0;
  if (this->fPattern != (UText *)0x0) {
    utext_close_63(this->fPattern);
    this->fPattern = (UText *)0x0;
  }
  if (this->fPatternString != (UnicodeString *)0x0) {
    (*(this->fPatternString->super_Replaceable).super_UObject._vptr_UObject[1])();
    this->fPatternString = (UnicodeString *)0x0;
  }
  uhash_close_63(this->fNamedCaptureMap);
  this->fNamedCaptureMap = (UHashtable *)0x0;
  return;
}

Assistant:

void RegexPattern::zap() {
    delete fCompiledPat;
    fCompiledPat = NULL;
    int i;
    for (i=1; i<fSets->size(); i++) {
        UnicodeSet *s;
        s = (UnicodeSet *)fSets->elementAt(i);
        if (s != NULL) {
            delete s;
        }
    }
    delete fSets;
    fSets = NULL;
    delete[] fSets8;
    fSets8 = NULL;
    delete fGroupMap;
    fGroupMap = NULL;
    delete fInitialChars;
    fInitialChars = NULL;
    delete fInitialChars8;
    fInitialChars8 = NULL;
    if (fPattern != NULL) {
        utext_close(fPattern);
        fPattern = NULL;
    }
    if (fPatternString != NULL) {
        delete fPatternString;
        fPatternString = NULL;
    }
    uhash_close(fNamedCaptureMap);
    fNamedCaptureMap = NULL;
}